

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

uint8_t * bam_aux_get(bam1_t *b,char *tag)

{
  char cVar1;
  char cVar2;
  int x;
  int y;
  uint8_t *s;
  char *tag_local;
  bam1_t *b_local;
  
  cVar1 = *tag;
  cVar2 = tag[1];
  _x = b->data + (long)(b->core).l_qseq +
                 (long)((b->core).l_qseq + 1 >> 1) +
                 (long)(int)((uint)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x18) & 0xff) +
                 (long)(int)((uint)(ushort)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x30) << 2
                            );
  while( true ) {
    if (b->data + b->l_data <= _x) {
      return (uint8_t *)0x0;
    }
    if ((uint)CONCAT11(*_x,_x[1]) == ((int)cVar1 << 8 | (int)cVar2)) break;
    _x = skip_aux(_x + 2);
  }
  return _x + 2;
}

Assistant:

uint8_t *bam_aux_get(const bam1_t *b, const char tag[2])
{
    uint8_t *s;
    int y = tag[0]<<8 | tag[1];
    s = bam_get_aux(b);
    while (s < b->data + b->l_data) {
        int x = (int)s[0]<<8 | s[1];
        s += 2;
        if (x == y) return s;
        s = skip_aux(s);
    }
    return 0;
}